

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate.cpp
# Opt level: O2

void __thiscall
QUtcTimeZonePrivate::QUtcTimeZonePrivate(QUtcTimeZonePrivate *this,qint32 offsetSeconds)

{
  Data *pDVar1;
  char *pcVar2;
  qsizetype qVar3;
  Data *pDVar4;
  char16_t *pcVar5;
  bool bVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  UtcData *this_00;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_c8;
  QByteArrayView local_a8;
  QByteArrayView local_98;
  QByteArrayView local_88;
  QArrayDataPointer<char> local_78;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (this->super_QTimeZonePrivate).super_QSharedData.ref.super_QAtomicInteger<int>.
  super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i = 0;
  (this->super_QTimeZonePrivate).m_id.d.d = (Data *)0x0;
  (this->super_QTimeZonePrivate).m_id.d.ptr = (char *)0x0;
  (this->super_QTimeZonePrivate).m_id.d.size = 0;
  (this->super_QTimeZonePrivate)._vptr_QTimeZonePrivate =
       (_func_int **)&PTR__QUtcTimeZonePrivate_00669fa8;
  (this->m_name).d.d = (Data *)0x0;
  (this->m_name).d.ptr = (char16_t *)0x0;
  (this->m_name).d.size = 0;
  (this->m_abbreviation).d.d = (Data *)0x0;
  (this->m_abbreviation).d.ptr = (char16_t *)0x0;
  (this->m_abbreviation).d.size = 0;
  (this->m_comment).d.size = 0;
  (this->m_comment).d.d = (Data *)0x0;
  (this->m_comment).d.ptr = (char16_t *)0x0;
  local_58.size = 0;
  local_78.size = 0;
  local_58.d = (Data *)0x0;
  local_58.ptr = (char16_t *)0x0;
  local_78.d = (Data *)0x0;
  local_78.ptr = (char *)0x0;
  uVar7 = 0x2a;
  this_00 = (UtcData *)QtTimeZoneCldr::utcDataTable;
  while (0 < (long)uVar7) {
    uVar8 = uVar7 >> 1;
    uVar9 = ~uVar8 + uVar7;
    uVar7 = uVar8;
    if (this_00[uVar8].offsetFromUtc < offsetSeconds) {
      uVar7 = uVar9;
      this_00 = this_00 + uVar8 + 1;
    }
  }
  if ((this_00 == (UtcData *)"16QTimeZonePrivate") || (this_00->offsetFromUtc != offsetSeconds)) {
    QTimeZonePrivate::isoOffsetFormat((QString *)&local_c8,offsetSeconds,ShortName);
    qVar3 = local_58.size;
    pcVar5 = local_58.ptr;
    pDVar4 = local_58.d;
    local_58.d = local_c8.d;
    local_58.ptr = local_c8.ptr;
    local_c8.d = pDVar4;
    local_c8.ptr = pcVar5;
    local_58.size = local_c8.size;
    local_c8.size = qVar3;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
    QString::toUtf8_helper((QByteArray *)&local_c8,(QString *)&local_58);
    qVar3 = local_78.size;
    pcVar2 = local_78.ptr;
    pDVar1 = local_78.d;
    local_78.d = (Data *)local_c8.d;
    local_78.ptr = (char *)local_c8.ptr;
    local_c8.d = (Data *)pDVar1;
    local_c8.ptr = (char16_t *)pcVar2;
    local_78.size = local_c8.size;
    local_c8.size = qVar3;
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_c8);
  }
  else {
    local_88 = QtTimeZoneCldr::UtcData::id(this_00);
    local_98.m_size = QByteArrayView::indexOf(&local_88,' ',0);
    if (local_98.m_size < 0) {
      local_98.m_size = local_88.m_size;
    }
    local_98.m_data = local_88.m_data;
    QTimeZonePrivate::utcQByteArray();
    local_a8.m_size = local_c8.size;
    local_a8.m_data = (storage_type *)local_c8.ptr;
    bVar6 = ::comparesEqual(&local_98,&local_a8);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_c8);
    if (bVar6) {
      QTimeZonePrivate::utcQByteArray();
      qVar3 = local_78.size;
      pcVar2 = local_78.ptr;
      pDVar1 = local_78.d;
      local_78.d = (Data *)local_c8.d;
      local_78.ptr = (char *)local_c8.ptr;
      local_c8.d = (Data *)pDVar1;
      local_c8.ptr = (char16_t *)pcVar2;
      local_78.size = local_c8.size;
      local_c8.size = qVar3;
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_c8);
      QTimeZonePrivate::utcQString();
    }
    else {
      QByteArrayView::toByteArray((QByteArray *)&local_c8,&local_98);
      qVar3 = local_78.size;
      pcVar2 = local_78.ptr;
      pDVar1 = local_78.d;
      local_78.d = (Data *)local_c8.d;
      local_78.ptr = (char *)local_c8.ptr;
      local_c8.d = (Data *)pDVar1;
      local_c8.ptr = (char16_t *)pcVar2;
      local_78.size = local_c8.size;
      local_c8.size = qVar3;
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_c8);
      QString::fromUtf8<void>((QString *)&local_c8,(QByteArray *)&local_78);
    }
    qVar3 = local_58.size;
    pcVar5 = local_58.ptr;
    pDVar4 = local_58.d;
    local_58.d = local_c8.d;
    local_58.ptr = local_c8.ptr;
    local_c8.d = pDVar4;
    local_c8.ptr = pcVar5;
    local_58.size = local_c8.size;
    local_c8.size = qVar3;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
  }
  init(this,(EVP_PKEY_CTX *)&local_78);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QUtcTimeZonePrivate::QUtcTimeZonePrivate(qint32 offsetSeconds)
{
    QString name;
    QByteArray id;
    // If there's an IANA ID for this offset, use it:
    const auto data = std::lower_bound(std::begin(utcDataTable), std::end(utcDataTable),
                                       offsetSeconds, atLowerUtcOffset);
    if (data != std::end(utcDataTable) && data->offsetFromUtc == offsetSeconds) {
        QByteArrayView ianaId = data->id();
        qsizetype cut = ianaId.indexOf(' ');
        QByteArrayView cutId = (cut < 0 ? ianaId : ianaId.first(cut));
        if (cutId == utcQByteArray()) {
            // optimize: reuse interned strings for the common case
            id = utcQByteArray();
            name = utcQString();
        } else {
            // fallback to allocate new strings otherwise
            id = cutId.toByteArray();
            name = QString::fromUtf8(id);
        }
        Q_ASSERT(!name.isEmpty());
    } else { // Fall back to a UTC-offset name:
        name = isoOffsetFormat(offsetSeconds, QTimeZone::ShortName);
        id = name.toUtf8();
    }
    init(id, offsetSeconds, name, name, QLocale::AnyTerritory, name);
}